

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionInfo::ExtensionInfo
          (ExtensionInfo *this,MessageLite *extendee,int param_number,FieldType type_param,
          bool isrepeated,bool ispacked)

{
  bool ispacked_local;
  bool isrepeated_local;
  FieldType type_param_local;
  int param_number_local;
  MessageLite *extendee_local;
  ExtensionInfo *this_local;
  
  this->message = extendee;
  this->number = param_number;
  this->type = type_param;
  this->is_repeated = isrepeated;
  this->is_packed = ispacked;
  this->is_lazy = kUndefined;
  memset(&this->field_6,0,0x10);
  this->descriptor = (FieldDescriptor *)0x0;
  this->lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
  return;
}

Assistant:

constexpr ExtensionInfo(const MessageLite* extendee, int param_number,
                          FieldType type_param, bool isrepeated, bool ispacked)
      : message(extendee),
        number(param_number),
        type(type_param),
        is_repeated(isrepeated),
        is_packed(ispacked),
        enum_validity_check() {}